

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O1

Parse_ast * __thiscall
lambda::parse_from(std::istream&)::helper::parse_app_list(lambda::Parse_ast_
          (Parse_ast *__return_storage_ptr__,void *this,Parse_ast *fst)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  *this_00;
  string_view s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  Shared_string local_188;
  Call local_170;
  Call local_160;
  undefined1 local_150 [40];
  __index_type local_128;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_120;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_f0;
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_c0;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_90;
  undefined1 local_68;
  _Variadic_union<lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  local_60;
  undefined1 local_38;
  
  parse_from::helper::eat_whitespace((helper *)this);
  iVar3 = std::istream::peek();
  if (iVar3 < 0x29) {
    if (iVar3 == -1) {
LAB_00103589:
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)__return_storage_ptr__,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)fst);
      return __return_storage_ptr__;
    }
    if (iVar3 == 0x28) {
      std::__detail::__variant::
      _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)&local_c0,
                        (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                         *)fst);
      parse_from::helper::parse_term((Parse_ast *)&local_f0,(helper *)this);
      Parse_ast::Call::Call(&local_160,(Parse_ast *)&local_c0,(Parse_ast *)&local_f0);
      local_60._0_8_ =
           local_160.callee_._M_t.
           super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
           super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
           super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
      local_60._8_8_ =
           local_160.argument_._M_t.
           super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
           super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
           super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
      local_160.callee_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_160.argument_._M_t.
      super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
      super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
      super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
           (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
           (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
      local_38 = 1;
      Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_60._M_first);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                           *)&local_60._M_first);
      std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
                (&local_160.argument_);
      std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
                (&local_160.callee_);
      std::__detail::__variant::
      _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
      ::~_Variant_storage(&local_f0);
      this_00 = &local_c0;
      goto LAB_00103717;
    }
  }
  else {
    if (iVar3 == 0x29) goto LAB_00103589;
    if ((iVar3 == 0x2f) || (iVar3 == 0x5c)) {
      puVar5 = (undefined8 *)__cxa_allocate_exception(0x20);
      s._M_str = "attempted to define a lambda in a callee";
      s._M_len = 0x28;
      ublib::Shared_string::Shared_string(&local_188,s);
      _Var2._M_pi = local_188.underlying_.
                    super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      *puVar5 = &PTR__Parse_error_00109b70;
      puVar5[1] = local_188.length_;
      puVar5[2] = local_188.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
      puVar5[3] = 0;
      local_188.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      puVar5[3] = _Var2._M_pi;
      local_188.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __cxa_throw(puVar5,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
  }
  iVar4 = isalpha(iVar3);
  if ((iVar3 != 0x5f) && (iVar4 == 0)) {
    parse_from::helper::unexpected_thing((helper *)this);
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::_Move_ctor_base((_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)&local_120,
                    (_Move_ctor_base<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                     *)fst);
  parse_from(std::istream&)::helper::get_var_abi_cxx11_(&local_1a8,this);
  local_150._8_8_ = local_1a8._M_string_length;
  paVar1 = &local_1a8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p == paVar1) {
    local_1b8._8_8_ = local_1a8.field_2._8_8_;
    local_1c8 = &local_1b8;
  }
  else {
    local_1c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p;
  }
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  local_150._0_8_ = local_150 + 0x10;
  if (local_1c8 == &local_1b8) {
    local_150._24_8_ = local_1b8._8_8_;
  }
  else {
    local_150._0_8_ = local_1c8;
  }
  local_1b8._M_allocated_capacity = (ulong)(uint7)local_1a8.field_2._M_allocated_capacity._1_7_ << 8
  ;
  local_128 = '\0';
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  Parse_ast::Call::Call(&local_170,(Parse_ast *)&local_120,(Parse_ast *)local_150);
  local_90._0_8_ =
       local_170.callee_._M_t.
       super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
       super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
       super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
  local_90._8_8_ =
       local_170.argument_._M_t.
       super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
       super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
       super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl;
  local_170.callee_._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
       (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
       (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
  local_170.argument_._M_t.
  super___uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>._M_t.
  super__Tuple_impl<0UL,_lambda::Parse_ast_*,_std::default_delete<lambda::Parse_ast>_>.
  super__Head_base<0UL,_lambda::Parse_ast_*,_false>._M_head_impl =
       (__uniq_ptr_data<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>,_true,_true>)
       (__uniq_ptr_impl<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>)0x0;
  local_68 = 1;
  Parse_ast_(__return_storage_ptr__,this,(Parse_ast *)&local_90._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)&local_90._M_first);
  std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
            (&local_170.argument_);
  std::unique_ptr<lambda::Parse_ast,_std::default_delete<lambda::Parse_ast>_>::~unique_ptr
            (&local_170.callee_);
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage((_Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
                       *)local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,
                    CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                             local_1a8.field_2._M_local_buf[0]) + 1);
  }
  this_00 = &local_120;
LAB_00103717:
  std::__detail::__variant::
  _Variant_storage<false,_lambda::Parse_ast::Variable,_lambda::Parse_ast::Call,_lambda::Parse_ast::Lambda>
  ::~_Variant_storage(this_00);
  return __return_storage_ptr__;
}

Assistant:

Parse_ast parse_app_list(Parse_ast fst) {
      eat_whitespace();
      auto ch = inp.peek();

      switch (ch) {
      case ')':
      case eof:
        return fst;
      case '(': {
        return parse_app_list(Parse_ast::Call(std::move(fst), parse_term()));
      }
      case '/':
      case '\\':
        throw Parse_error("attempted to define a lambda in a callee");
      default:
        if (std::isalpha(ch) or ch == '_') {
          return parse_app_list(
              Parse_ast::Call(std::move(fst), Parse_ast::Variable(get_var())));
        } else {
          unexpected_thing();
        }
      }
    }